

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool tinyusdz::tydra::anon_unknown_0::TryConvertFacevaryingToVertex
               (VertexAttribute *src,VertexAttribute *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,string *err,
               float eps)

{
  uint32_t uVar1;
  pointer puVar2;
  bool bVar3;
  size_t sVar4;
  ostream *poVar5;
  uint *args;
  VertexAttributeFormat f;
  long lVar6;
  VertexAttributeFormat VVar7;
  char *pcVar8;
  long lVar9;
  size_type __new_size;
  vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> vdst;
  ostringstream ss_e;
  undefined1 local_1f8 [44];
  float local_1cc;
  undefined1 local_1c8 [112];
  ios_base local_158 [264];
  string local_50;
  
  if (dst == (VertexAttribute *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
               ,0x5b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"TryConvertFacevaryingToVertex",0x1d);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x2b4);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar8 = "Output `dst` is nullptr.";
    lVar6 = 0x18;
LAB_0033deba:
    poVar5 = (ostream *)local_1c8;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,lVar6);
LAB_0033ded1:
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,local_1f8._0_8_);
      if ((pointer)local_1f8._0_8_ != (pointer)(local_1f8 + 0x10)) {
        operator_delete((void *)local_1f8._0_8_,(ulong)((long)*(double (*) [4])local_1f8._16_8_ + 1)
                       );
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    ::std::ios_base::~ios_base(local_158);
    return false;
  }
  if (src->variability != FaceVarying) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
               ,0x5b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"TryConvertFacevaryingToVertex",0x1d);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x2b8);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar8 = "Input must be \'facevarying\' attribute";
    lVar6 = 0x25;
    goto LAB_0033deba;
  }
  if (src->elementSize != 1) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
               ,0x5b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"TryConvertFacevaryingToVertex",0x1d);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,700);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar8 = "Input\'s element_size must be 1.";
    lVar6 = 0x1f;
    goto LAB_0033deba;
  }
  uVar1 = src->stride;
  local_1cc = eps;
  if (uVar1 == 0) {
    VVar7 = src->format;
  }
  else {
    VVar7 = src->format;
    sVar4 = VertexAttributeFormatSize(VVar7);
    if ((uint32_t)sVar4 != uVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"TryConvertFacevaryingToVertex",0x1d);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x2c2);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"Input attribute must be tightly packed. stride_bytes = ",0x37
                );
      if (src->stride == 0) {
        VertexAttributeFormatSize(src->format);
      }
      poVar5 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,", format_size = ",0x10);
      VertexAttributeFormatSize(src->format);
      poVar5 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      goto LAB_0033ded1;
    }
  }
  args = &switchD_0033df65::switchdataD_005e0f5c;
  switch(VVar7) {
  case Bool:
  case Byte:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = TryConvertFacevaryingToVertexInt<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1f8,
                       faceVertexIndices);
    goto LAB_0033e3f3;
  case Char:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<signed_char,_std::allocator<signed_char>_>::resize
              ((vector<signed_char,_std::allocator<signed_char>_> *)local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = TryConvertFacevaryingToVertexInt<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_1c8,
                       (vector<signed_char,_std::allocator<signed_char>_> *)local_1f8,
                       faceVertexIndices);
LAB_0033e3f3:
    if (bVar3 == false) goto LAB_0033ee46;
    ::std::__cxx11::string::_M_assign((string *)dst);
    dst->elementSize = 1;
    VVar7 = src->format;
    dst->format = VVar7;
    dst->variability = Vertex;
    lVar6 = local_1f8._8_8_ - local_1f8._0_8_;
    break;
  default:
    if (err == (string *)0x0) {
      return false;
    }
    local_1f8._0_8_ = (pointer)(local_1f8 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,"Unsupported/Unimplemented VertexAttributeFormat: {}","");
    tydra::to_string_abi_cxx11_(&local_50,(tydra *)(ulong)src->format,f);
    fmt::format<std::__cxx11::string>
              ((string *)local_1c8,(fmt *)local_1f8,(string *)&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    ::std::__cxx11::string::_M_append((char *)err,local_1c8._0_8_);
    if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_1f8._0_8_ == (pointer)(local_1f8 + 0x10)) {
      return false;
    }
    operator_delete((void *)local_1f8._0_8_,(ulong)((long)*(double (*) [4])local_1f8._16_8_ + 1));
    return false;
  case Short:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<short,_std::allocator<short>_>::resize
              ((vector<short,_std::allocator<short>_> *)local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = TryConvertFacevaryingToVertexInt<short>
                      ((vector<short,_std::allocator<short>_> *)local_1c8,
                       (vector<short,_std::allocator<short>_> *)local_1f8,faceVertexIndices);
    goto LAB_0033ea1d;
  case Ushort:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = TryConvertFacevaryingToVertexInt<unsigned_short>
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_1c8,
                       (vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_1f8,
                       faceVertexIndices);
    goto LAB_0033ea1d;
  case Half:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::resize
              ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)local_1c8,
               sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = (anonymous_namespace)::TryConvertFacevaryingToVertexFloat<tinyusdz::value::half,float>
                      ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                       local_1c8,
                       (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                       local_1f8,faceVertexIndices,local_1cc);
LAB_0033ea1d:
    if (bVar3 == false) goto LAB_0033ee46;
    ::std::__cxx11::string::_M_assign((string *)dst);
    dst->elementSize = 1;
    VVar7 = src->format;
    dst->format = VVar7;
    dst->variability = Vertex;
    lVar6 = (long)(local_1f8._8_8_ - local_1f8._0_8_) >> 1;
    break;
  case Half2:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::
    vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
    ::resize((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
              *)local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = (anonymous_namespace)::
            TryConvertFacevaryingToVertexFloat<std::array<tinyusdz::value::half,2ul>,float>
                      ((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                        *)local_1c8,
                       (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                        *)local_1f8,faceVertexIndices,local_1cc);
    goto LAB_0033ebaf;
  case Half3:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::
    vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
    ::resize((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              *)local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = (anonymous_namespace)::
            TryConvertFacevaryingToVertexFloat<std::array<tinyusdz::value::half,3ul>,float>
                      ((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        *)local_1c8,
                       (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        *)local_1f8,faceVertexIndices,local_1cc);
    if (!bVar3) goto LAB_0033ee46;
    ::std::__cxx11::string::_M_assign((string *)dst);
    dst->elementSize = 1;
    VVar7 = src->format;
    dst->format = VVar7;
    dst->variability = Vertex;
    lVar6 = (long)(local_1f8._8_8_ - local_1f8._0_8_) >> 1;
    goto LAB_0033e8c8;
  case Half4:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::
    vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
    ::resize((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
              *)local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = (anonymous_namespace)::
            TryConvertFacevaryingToVertexFloat<std::array<tinyusdz::value::half,4ul>,float>
                      ((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                        *)local_1c8,
                       (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                        *)local_1f8,faceVertexIndices,local_1cc);
    goto LAB_0033eb18;
  case Float:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = (anonymous_namespace)::TryConvertFacevaryingToVertexFloat<float,float>
                      ((vector<float,_std::allocator<float>_> *)local_1c8,
                       (vector<float,_std::allocator<float>_> *)local_1f8,faceVertexIndices,
                       local_1cc);
    goto LAB_0033ebaf;
  case Vec2:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::resize
              ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)local_1c8
               ,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = (anonymous_namespace)::TryConvertFacevaryingToVertexFloat<std::array<float,2ul>,float>
                      ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                       local_1c8,
                       (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                       local_1f8,faceVertexIndices,local_1cc);
    goto LAB_0033eb18;
  case Vec3:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::resize
              ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)local_1c8
               ,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = (anonymous_namespace)::TryConvertFacevaryingToVertexFloat<std::array<float,3ul>,float>
                      ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       local_1c8,
                       (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       local_1f8,faceVertexIndices,local_1cc);
    goto LAB_0033e88a;
  case Vec4:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::resize
              ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)local_1c8
               ,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = (anonymous_namespace)::TryConvertFacevaryingToVertexFloat<std::array<float,4ul>,float>
                      ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                       local_1c8,
                       (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                       local_1f8,faceVertexIndices,local_1cc);
    goto LAB_0033ec9c;
  case Int:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = TryConvertFacevaryingToVertexInt<int>
                      ((vector<int,_std::allocator<int>_> *)local_1c8,
                       (vector<int,_std::allocator<int>_> *)local_1f8,faceVertexIndices);
    goto LAB_0033ebaf;
  case Ivec2:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::resize
              ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)local_1c8,
               sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = (anonymous_namespace)::TryConvertFacevaryingToVertexInt<std::array<int,2ul>>
                      ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                       local_1c8,
                       (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                       local_1f8,faceVertexIndices);
    goto LAB_0033eb18;
  case Ivec3:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::resize
              ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)local_1c8,
               sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = (anonymous_namespace)::TryConvertFacevaryingToVertexInt<std::array<int,3ul>>
                      ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                       local_1c8,
                       (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                       local_1f8,faceVertexIndices);
    goto LAB_0033e88a;
  case Ivec4:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::resize
              ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)local_1c8,
               sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = (anonymous_namespace)::TryConvertFacevaryingToVertexInt<std::array<int,4ul>>
                      ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                       local_1c8,
                       (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                       local_1f8,faceVertexIndices);
    goto LAB_0033ec9c;
  case Uint:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = TryConvertFacevaryingToVertexInt<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1f8,
                       faceVertexIndices);
LAB_0033ebaf:
    if (bVar3 == false) goto LAB_0033ee46;
    ::std::__cxx11::string::_M_assign((string *)dst);
    dst->elementSize = 1;
    VVar7 = src->format;
    dst->format = VVar7;
    dst->variability = Vertex;
    lVar6 = (long)(local_1f8._8_8_ - local_1f8._0_8_) >> 2;
    break;
  case Uvec2:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
    resize((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> *
           )local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = (anonymous_namespace)::TryConvertFacevaryingToVertexInt<std::array<unsigned_int,2ul>>
                      ((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                        *)local_1c8,
                       (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                        *)local_1f8,faceVertexIndices);
    goto LAB_0033eb18;
  case Uvec3:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
    resize((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_> *
           )local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = (anonymous_namespace)::TryConvertFacevaryingToVertexInt<std::array<unsigned_int,3ul>>
                      ((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                        *)local_1c8,
                       (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                        *)local_1f8,faceVertexIndices);
LAB_0033e88a:
    if (bVar3 == false) goto LAB_0033ee46;
    ::std::__cxx11::string::_M_assign((string *)dst);
    dst->elementSize = 1;
    VVar7 = src->format;
    dst->format = VVar7;
    dst->variability = Vertex;
    lVar6 = (long)(local_1f8._8_8_ - local_1f8._0_8_) >> 2;
LAB_0033e8c8:
    sVar4 = VertexAttributeFormatSize(VVar7);
    lVar9 = -0x5555555555555555;
LAB_0033ee22:
    __new_size = lVar9 * sVar4 * lVar6;
    goto LAB_0033ee2d;
  case Uvec4:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>::
    resize((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_> *
           )local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = (anonymous_namespace)::TryConvertFacevaryingToVertexInt<std::array<unsigned_int,4ul>>
                      ((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                        *)local_1c8,
                       (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                        *)local_1f8,faceVertexIndices);
    goto LAB_0033ec9c;
  case Double:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = (anonymous_namespace)::TryConvertFacevaryingToVertexFloat<double,double>
                      ((vector<double,_std::allocator<double>_> *)local_1c8,
                       (vector<double,_std::allocator<double>_> *)local_1f8,faceVertexIndices,
                       (double)local_1cc);
LAB_0033eb18:
    if (bVar3 == false) goto LAB_0033ee46;
    ::std::__cxx11::string::_M_assign((string *)dst);
    dst->elementSize = 1;
    VVar7 = src->format;
    dst->format = VVar7;
    dst->variability = Vertex;
    lVar6 = (long)(local_1f8._8_8_ - local_1f8._0_8_) >> 3;
    break;
  case Dvec2:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::resize
              ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
               local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = (anonymous_namespace)::TryConvertFacevaryingToVertexFloat<std::array<double,2ul>,double>
                      ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *
                       )local_1c8,
                       (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *
                       )local_1f8,faceVertexIndices,(double)local_1cc);
    goto LAB_0033ec9c;
  case Dvec3:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::resize
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = (anonymous_namespace)::TryConvertFacevaryingToVertexFloat<std::array<double,3ul>,double>
                      ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *
                       )local_1c8,
                       (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *
                       )local_1f8,faceVertexIndices,(double)local_1cc);
    if (!bVar3) goto LAB_0033ee46;
    ::std::__cxx11::string::_M_assign((string *)dst);
    dst->elementSize = 1;
    VVar7 = src->format;
    dst->format = VVar7;
    dst->variability = Vertex;
    lVar6 = (long)(local_1f8._8_8_ - local_1f8._0_8_) >> 3;
    goto LAB_0033e8c8;
  case Dvec4:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::resize
              ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
               local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = (anonymous_namespace)::TryConvertFacevaryingToVertexFloat<std::array<double,4ul>,double>
                      ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *
                       )local_1c8,
                       (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *
                       )local_1f8,faceVertexIndices,(double)local_1cc);
    goto LAB_0033e69f;
  case Mat2:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::resize
              ((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
               local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = TryConvertFacevaryingToVertexMat<tinyusdz::value::matrix2f>
                      ((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                        *)local_1c8,
                       (vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                        *)local_1f8,faceVertexIndices);
LAB_0033ec9c:
    if (bVar3 == false) goto LAB_0033ee46;
    ::std::__cxx11::string::_M_assign((string *)dst);
    dst->elementSize = 1;
    VVar7 = src->format;
    dst->format = VVar7;
    dst->variability = Vertex;
    lVar6 = (long)(local_1f8._8_8_ - local_1f8._0_8_) >> 4;
    break;
  case Mat3:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::resize
              ((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
               local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = TryConvertFacevaryingToVertexMat<tinyusdz::value::matrix3f>
                      ((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                        *)local_1c8,
                       (vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                        *)local_1f8,faceVertexIndices);
    if (!bVar3) goto LAB_0033ee46;
    ::std::__cxx11::string::_M_assign((string *)dst);
    dst->elementSize = 1;
    VVar7 = src->format;
    dst->format = VVar7;
    dst->variability = Vertex;
    lVar6 = (long)(local_1f8._8_8_ - local_1f8._0_8_) >> 2;
    goto LAB_0033ee13;
  case Mat4:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::resize
              ((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
               local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = TryConvertFacevaryingToVertexMat<tinyusdz::value::matrix4f>
                      ((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                        *)local_1c8,
                       (vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                        *)local_1f8,faceVertexIndices);
    if (!bVar3) goto LAB_0033ee46;
    ::std::__cxx11::string::_M_assign((string *)dst);
    dst->elementSize = 1;
    VVar7 = src->format;
    dst->format = VVar7;
    dst->variability = Vertex;
    lVar6 = (long)(local_1f8._8_8_ - local_1f8._0_8_) >> 6;
    break;
  case Dmat2:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::resize
              ((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
               local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = TryConvertFacevaryingToVertexMat<tinyusdz::value::matrix2d>
                      ((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                        *)local_1c8,
                       (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                        *)local_1f8,faceVertexIndices);
LAB_0033e69f:
    if (bVar3 == false) goto LAB_0033ee46;
    ::std::__cxx11::string::_M_assign((string *)dst);
    dst->elementSize = 1;
    VVar7 = src->format;
    dst->format = VVar7;
    dst->variability = Vertex;
    lVar6 = (long)(local_1f8._8_8_ - local_1f8._0_8_) >> 5;
    break;
  case Dmat3:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::resize
              ((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
               local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = TryConvertFacevaryingToVertexMat<tinyusdz::value::matrix3d>
                      ((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                        *)local_1c8,
                       (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                        *)local_1f8,faceVertexIndices);
    if (!bVar3) goto LAB_0033ee46;
    ::std::__cxx11::string::_M_assign((string *)dst);
    dst->elementSize = 1;
    VVar7 = src->format;
    dst->format = VVar7;
    dst->variability = Vertex;
    lVar6 = (long)(local_1f8._8_8_ - local_1f8._0_8_) >> 3;
LAB_0033ee13:
    sVar4 = VertexAttributeFormatSize(VVar7);
    lVar9 = -0x71c71c71c71c71c7;
    goto LAB_0033ee22;
  case Dmat4:
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    sVar4 = VertexAttribute::vertex_count(src);
    ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::resize
              ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
               local_1c8,sVar4);
    puVar2 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((void *)local_1c8._0_8_,puVar2,
           (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    local_1f8._16_8_ = (pointer)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    bVar3 = TryConvertFacevaryingToVertexMat<tinyusdz::value::matrix4d>
                      ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                        *)local_1c8,
                       (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                        *)local_1f8,faceVertexIndices);
    if (!bVar3) goto LAB_0033ee46;
    ::std::__cxx11::string::_M_assign((string *)dst);
    dst->elementSize = 1;
    VVar7 = src->format;
    dst->format = VVar7;
    dst->variability = Vertex;
    lVar6 = (long)(local_1f8._8_8_ - local_1f8._0_8_) >> 7;
  }
  sVar4 = VertexAttributeFormatSize(VVar7);
  __new_size = lVar6 * sVar4;
LAB_0033ee2d:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,__new_size);
  puVar2 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  memcpy(puVar2,(void *)local_1f8._0_8_,
         (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish - (long)puVar2);
LAB_0033ee46:
  if ((pointer)local_1f8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ - local_1f8._0_8_);
  }
  if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ - local_1c8._0_8_);
  }
  return bVar3;
}

Assistant:

static bool TryConvertFacevaryingToVertex(
    const VertexAttribute &src, VertexAttribute *dst,
    const std::vector<uint32_t> &faceVertexIndices, std::string *err,
    const float eps) {
  DCOUT("TryConvertFacevaryingToVertex");
  if (!dst) {
    PUSH_ERROR_AND_RETURN("Output `dst` is nullptr.");
  }

  if (!src.is_facevarying()) {
    PUSH_ERROR_AND_RETURN("Input must be 'facevarying' attribute");
  }

  if (src.element_size() != 1) {
    PUSH_ERROR_AND_RETURN("Input's element_size must be 1.");
  }

  if ((src.stride != 0) && (src.stride_bytes() != src.format_size())) {
    PUSH_ERROR_AND_RETURN(
        "Input attribute must be tightly packed. stride_bytes = "
        << src.stride_bytes() << ", format_size = " << src.format_size());
  }

#define CONVERT_FUN_INT(__fmt, __ty)                                      \
  if (src.format == __fmt) {                                              \
    std::vector<__ty> vsrc;                                               \
    vsrc.resize(src.vertex_count());                                      \
    memcpy(vsrc.data(), src.get_data().data(), src.get_data().size());    \
    std::vector<__ty> vdst;                                               \
    bool ret = TryConvertFacevaryingToVertexInt<__ty>(vsrc, &vdst,        \
                                                      faceVertexIndices); \
    if (!ret) {                                                           \
      return false;                                                       \
    }                                                                     \
    dst->name = src.name;                                                 \
    dst->elementSize = 1;                                                 \
    dst->format = src.format;                                             \
    dst->variability = VertexVariability::Vertex;                         \
    dst->data.resize(vdst.size() * src.format_size());                    \
    memcpy(dst->data.data(), vdst.data(), dst->data.size());              \
    return true;                                                          \
  } else

#define CONVERT_FUN_FLOAT(__fmt, __ty, __epsty)                        \
  if (src.format == __fmt) {                                           \
    std::vector<__ty> vsrc;                                            \
    vsrc.resize(src.vertex_count());                                   \
    memcpy(vsrc.data(), src.get_data().data(), src.get_data().size()); \
    std::vector<__ty> vdst;                                            \
    bool ret = TryConvertFacevaryingToVertexFloat<__ty, __epsty>(      \
        vsrc, &vdst, faceVertexIndices, __epsty(eps));                 \
    if (!ret) {                                                        \
      return false;                                                    \
    }                                                                  \
    dst->name = src.name;                                                 \
    dst->elementSize = 1;                                              \
    dst->format = src.format;                                          \
    dst->variability = VertexVariability::Vertex;                      \
    dst->data.resize(vdst.size() * src.format_size());                 \
    memcpy(dst->data.data(), vdst.data(), dst->data.size());           \
    return true;                                                       \
  } else

#define CONVERT_FUN_MAT(__fmt, __ty)                                      \
  if (src.format == __fmt) {                                              \
    std::vector<__ty> vsrc;                                               \
    vsrc.resize(src.vertex_count());                                      \
    memcpy(vsrc.data(), src.get_data().data(), src.get_data().size());    \
    std::vector<__ty> vdst;                                               \
    bool ret = TryConvertFacevaryingToVertexMat<__ty>(vsrc, &vdst,        \
                                                      faceVertexIndices); \
    if (!ret) {                                                           \
      return false;                                                       \
    }                                                                     \
    dst->name = src.name;                                                 \
    dst->elementSize = 1;                                                 \
    dst->format = src.format;                                             \
    dst->variability = VertexVariability::Vertex;                         \
    dst->data.resize(vdst.size() * src.format_size());                    \
    memcpy(dst->data.data(), vdst.data(), dst->data.size());              \
    return true;                                                          \
  } else

  // NOTE: VertexAttributeFormat::Bool is preserved
  CONVERT_FUN_INT(VertexAttributeFormat::Bool, uint8_t)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Float, float, float)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Vec2, value::float2, float)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Vec3, value::float3, float)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Vec4, value::float4, float)
  CONVERT_FUN_INT(VertexAttributeFormat::Char, signed char)
  // CONVERT_FUN(VertexAttributeFormat::Char2, value::char2)
  // CONVERT_FUN(VertexAttributeFormat::Char3, value::char3)
  // CONVERT_FUN(VertexAttributeFormat::Char4,    // int8x4
  CONVERT_FUN_INT(VertexAttributeFormat::Byte, uint8_t)
  // CONVERT_FUN(VertexAttributeFormat::Byte2,    // uint8x2
  // CONVERT_FUN(VertexAttributeFormat::Byte3,    // uint8x3
  // CONVERT_FUN(VertexAttributeFormat::Byte4,    // uint8x4
  CONVERT_FUN_INT(VertexAttributeFormat::Short, int16_t)
  // CONVERT_FUN(VertexAttributeFormat::Short2, value::short2)
  // CONVERT_FUN(VertexAttributeFormat::Short3, value::short3)
  // CONVERT_FUN(VertexAttributeFormat::Short4, value::short4)
  CONVERT_FUN_INT(VertexAttributeFormat::Ushort, uint16_t)
  // CONVERT_FUN(VertexAttributeFormat::Ushort2, uint16_t)
  // CONVERT_FUN(VertexAttributeFormat::Ushort3, uint16_t)
  // CONVERT_FUN(VertexAttributeFormat::Ushort4, uint16_t)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Half, value::half, float)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Half2, value::half2, float)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Half3, value::half3, float)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Half4, value::half4, float)
  CONVERT_FUN_INT(VertexAttributeFormat::Int, int)
  CONVERT_FUN_INT(VertexAttributeFormat::Ivec2, value::int2)
  CONVERT_FUN_INT(VertexAttributeFormat::Ivec3, value::int3)
  CONVERT_FUN_INT(VertexAttributeFormat::Ivec4, value::int4)
  CONVERT_FUN_INT(VertexAttributeFormat::Uint, uint32_t)
  CONVERT_FUN_INT(VertexAttributeFormat::Uvec2, value::uint2)
  CONVERT_FUN_INT(VertexAttributeFormat::Uvec3, value::uint3)
  CONVERT_FUN_INT(VertexAttributeFormat::Uvec4, value::uint4)
  // NOTE: Use float precision eps is upcasted to double precision.
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Double, double, double)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Dvec2, value::double2, double)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Dvec3, value::double3, double)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Dvec4, value::double4, double)
  CONVERT_FUN_MAT(VertexAttributeFormat::Mat2, value::matrix2f)
  CONVERT_FUN_MAT(VertexAttributeFormat::Mat3, value::matrix3f)
  CONVERT_FUN_MAT(VertexAttributeFormat::Mat4, value::matrix4f)
  CONVERT_FUN_MAT(VertexAttributeFormat::Dmat2, value::matrix2d)
  CONVERT_FUN_MAT(VertexAttributeFormat::Dmat3, value::matrix3d)
  CONVERT_FUN_MAT(VertexAttributeFormat::Dmat4, value::matrix4d) {
    if (err) {
      (*err) +=
          fmt::format("Unsupported/Unimplemented VertexAttributeFormat: {}",
                      to_string(src.format));
    }
  }

#undef CONVERT_FUN_INT
#undef CONVERT_FUN_FLOAT
#undef CONVERT_FUN_MAT

  return false;
}